

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Decode
          (Minefield_Response_NACK_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer puVar1;
  KUINT16 KVar2;
  KException *this_00;
  int iVar3;
  undefined7 in_register_00000011;
  KUINT8 i;
  byte bVar4;
  allocator<char> local_49;
  KUINT8 ui8Tmp;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x19 < iVar3 + (uint)KVar2) {
    puVar1 = (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    Minefield_Header::Decode(&this->super_Minefield_Header,stream,ignoreHeader);
    (*(this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_ReqID,stream);
    KDataStream::Read(stream,&this->m_ui8ReqID);
    KDataStream::Read(stream,&this->m_ui8NumMisPdus);
    ui8Tmp = '\0';
    for (bVar4 = 0; bVar4 < this->m_ui8NumMisPdus; bVar4 = bVar4 + 1) {
      KDataStream::Read(stream,&ui8Tmp);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->m_vSeqNums,&ui8Tmp);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ui8Tmp,"Decode",&local_49);
  KException::KException(this_00,(KString *)&ui8Tmp,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Minefield_Response_NACK_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_RESPONSE_NACK_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vSeqNums.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReqID
           >> m_ui8ReqID
           >> m_ui8NumMisPdus;

    KUINT8 ui8Tmp = 0;
    for( KUINT8 i = 0; i < m_ui8NumMisPdus; ++i )
    {
        stream >> ui8Tmp;
        m_vSeqNums.push_back( ui8Tmp );
    }
}